

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_package.h
# Opt level: O2

bool __thiscall
ParsePackage::_SafeSprintf<long>
          (ParsePackage *this,bool is_str,char *buf,char *end,char *format,long *args)

{
  size_t sVar1;
  undefined7 in_register_00000031;
  char temp_buf [4096];
  char local_1038 [4104];
  
  if ((int)CONCAT71(in_register_00000031,is_str) == 0) {
    local_1038[0x30] = '\0';
    local_1038[0x31] = '\0';
    local_1038[0x32] = '\0';
    local_1038[0x33] = '\0';
    local_1038[0x34] = '\0';
    local_1038[0x35] = '\0';
    local_1038[0x36] = '\0';
    local_1038[0x37] = '\0';
    local_1038[0x38] = '\0';
    local_1038[0x39] = '\0';
    local_1038[0x3a] = '\0';
    local_1038[0x3b] = '\0';
    local_1038[0x3c] = '\0';
    local_1038[0x3d] = '\0';
    local_1038[0x3e] = '\0';
    local_1038[0x3f] = '\0';
    local_1038[0x20] = '\0';
    local_1038[0x21] = '\0';
    local_1038[0x22] = '\0';
    local_1038[0x23] = '\0';
    local_1038[0x24] = '\0';
    local_1038[0x25] = '\0';
    local_1038[0x26] = '\0';
    local_1038[0x27] = '\0';
    local_1038[0x28] = '\0';
    local_1038[0x29] = '\0';
    local_1038[0x2a] = '\0';
    local_1038[0x2b] = '\0';
    local_1038[0x2c] = '\0';
    local_1038[0x2d] = '\0';
    local_1038[0x2e] = '\0';
    local_1038[0x2f] = '\0';
    local_1038[0x10] = '\0';
    local_1038[0x11] = '\0';
    local_1038[0x12] = '\0';
    local_1038[0x13] = '\0';
    local_1038[0x14] = '\0';
    local_1038[0x15] = '\0';
    local_1038[0x16] = '\0';
    local_1038[0x17] = '\0';
    local_1038[0x18] = '\0';
    local_1038[0x19] = '\0';
    local_1038[0x1a] = '\0';
    local_1038[0x1b] = '\0';
    local_1038[0x1c] = '\0';
    local_1038[0x1d] = '\0';
    local_1038[0x1e] = '\0';
    local_1038[0x1f] = '\0';
    local_1038[0] = '\0';
    local_1038[1] = '\0';
    local_1038[2] = '\0';
    local_1038[3] = '\0';
    local_1038[4] = '\0';
    local_1038[5] = '\0';
    local_1038[6] = '\0';
    local_1038[7] = '\0';
    local_1038[8] = '\0';
    local_1038[9] = '\0';
    local_1038[10] = '\0';
    local_1038[0xb] = '\0';
    local_1038[0xc] = '\0';
    local_1038[0xd] = '\0';
    local_1038[0xe] = '\0';
    local_1038[0xf] = '\0';
  }
  else {
    memset(local_1038,0,0x1000);
  }
  sprintf(local_1038,format,*args);
  sVar1 = strlen(local_1038);
  if (buf + (int)sVar1 <= end) {
    strcpy(buf,local_1038);
  }
  return buf + (int)sVar1 <= end;
}

Assistant:

bool ParsePackage::_SafeSprintf(bool is_str, char* buf, char* end, const char* format, Args&&... args) {
    if (is_str) {
        char temp_buf[4096] = { 0 };
        sprintf(temp_buf, format, std::forward<Args>(args)...);
        int len = strlen(temp_buf);
        if (len + buf > end) {
            return false;
        }
        sprintf(buf, "%s", temp_buf);
        return true;

    } else {
        char temp_buf[64] = { 0 };
        sprintf(temp_buf, format, std::forward<Args>(args)...);
        int len = strlen(temp_buf);
        if (len + buf > end) {
            return false;
        }
        sprintf(buf, "%s", temp_buf);
        return true;
    }
}